

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O3

index_t __thiscall
GEO::PeriodicDelaunay3dThread::create_first_tetrahedron(PeriodicDelaunay3dThread *this)

{
  char cVar1;
  char cVar2;
  int iVar3;
  double *pdVar4;
  bool bVar5;
  uint uVar6;
  Sign SVar7;
  index_t iVar8;
  index_t iVar9;
  index_t f_1;
  pointer piVar10;
  int iVar11;
  uint uVar12;
  char *pcVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  index_t f;
  int iVar18;
  long lVar19;
  uint uVar20;
  index_t t [4];
  uint local_74;
  index_t aiStack_58 [6];
  PeriodicDelaunay3dThread *local_40;
  ulong local_38;
  
  iVar8 = 0xffffffff;
  if (3 < this->nb_vertices_) {
    uVar6 = (this->super_Periodic).nb_vertices_non_periodic_;
    uVar17 = 1;
    if (1 < (ulong)uVar6) {
      pdVar4 = this->vertices_;
      uVar16 = 1;
      uVar14 = 3;
      do {
        uVar15 = uVar14 & 0xffffffff;
        uVar17 = uVar16;
        if ((((*pdVar4 != pdVar4[uVar15]) || (NAN(*pdVar4) || NAN(pdVar4[uVar15]))) ||
            (pdVar4[1] != pdVar4[uVar15 + 1])) ||
           (((NAN(pdVar4[1]) || NAN(pdVar4[uVar15 + 1]) || (pdVar4[2] != pdVar4[uVar15 + 2])) ||
            (NAN(pdVar4[2]) || NAN(pdVar4[uVar15 + 2]))))) break;
        uVar16 = uVar16 + 1;
        uVar14 = uVar14 + 3;
        uVar17 = uVar6;
      } while ((ulong)uVar6 * 3 != uVar14);
    }
    if (uVar17 != this->nb_vertices_) {
      uVar6 = uVar17 * 3 + 6;
      uVar16 = 0;
      do {
        uVar20 = uVar16;
        uVar12 = uVar6;
        if ((this->super_Periodic).nb_vertices_non_periodic_ <= uVar17 + 1 + uVar20) break;
        pdVar4 = this->vertices_;
        bVar5 = PCK::points_are_colinear_3d(pdVar4,pdVar4 + uVar17 * 3,pdVar4 + (uVar12 - 3));
        uVar6 = uVar12 + 3;
        uVar16 = uVar20 + 1;
      } while (bVar5);
      local_74 = uVar17 + uVar20 + 1;
      if (local_74 != this->nb_vertices_) {
        iVar18 = uVar20 + 2;
        uVar20 = ~uVar20;
        uVar6 = uVar12 - 3;
        do {
          uVar16 = uVar17 + iVar18;
          if ((this->super_Periodic).nb_vertices_non_periodic_ <= uVar16) {
            if (uVar16 == this->nb_vertices_) {
              return 0xffffffff;
            }
            goto LAB_0016f724;
          }
          pdVar4 = this->vertices_;
          SVar7 = PCK::orient_3d(pdVar4,pdVar4 + uVar17 * 3,pdVar4 + uVar6,pdVar4 + uVar12);
          iVar18 = iVar18 + 1;
          uVar20 = uVar20 - 1;
          uVar12 = uVar12 + 3;
        } while (SVar7 == ZERO);
        if (uVar17 - this->nb_vertices_ != uVar20) {
          uVar16 = uVar17 - uVar20;
          if (SVar7 == NEGATIVE) {
            uVar16 = local_74;
            local_74 = uVar17 - uVar20;
          }
LAB_0016f724:
          iVar8 = new_tetrahedron(this);
          local_38 = (ulong)(iVar8 << 2);
          piVar10 = (this->cell_to_v_store_->
                    super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
                    super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
                    super__Vector_impl_data._M_start;
          piVar10[local_38] = 0;
          piVar10[local_38 + 1] = uVar17;
          piVar10[local_38 + 2] = local_74;
          piVar10[local_38 + 3] = uVar16;
          pcVar13 = &DAT_001abb12;
          lVar19 = 0;
          local_40 = this;
          do {
            iVar11 = (int)local_38;
            iVar18 = piVar10[(uint)(*pcVar13 + iVar11)];
            iVar3 = piVar10[(uint)(pcVar13[-1] + iVar11)];
            iVar11 = piVar10[(uint)(pcVar13[-2] + iVar11)];
            iVar9 = new_tetrahedron(this);
            uVar14 = (ulong)(iVar9 * 4);
            piVar10 = (this->cell_to_v_store_->
                      super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
                      super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
                      super__Vector_impl_data._M_start;
            piVar10[uVar14] = -1;
            piVar10[uVar14 + 1] = iVar18;
            piVar10[uVar14 + 2] = iVar3;
            piVar10[uVar14 + 3] = iVar11;
            aiStack_58[lVar19] = iVar9;
            lVar19 = lVar19 + 1;
            pcVar13 = pcVar13 + 3;
          } while (lVar19 != 4);
          piVar10 = (local_40->cell_to_cell_store_->
                    super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
                    super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
                    super__Vector_impl_data._M_start;
          lVar19 = 0;
          do {
            iVar9 = aiStack_58[lVar19];
            piVar10[iVar9 * 4] = iVar8;
            piVar10[local_38 + lVar19] = iVar9;
            lVar19 = lVar19 + 1;
          } while (lVar19 != 4);
          pcVar13 = &DAT_001abb12;
          lVar19 = 0;
          do {
            cVar1 = pcVar13[-1];
            cVar2 = pcVar13[-2];
            uVar14 = (ulong)(aiStack_58[lVar19] << 2);
            piVar10[uVar14 + 1] = aiStack_58[(uint)(int)*pcVar13];
            piVar10[uVar14 + 2] = aiStack_58[(long)cVar1 & 0xffffffff];
            piVar10[uVar14 + 3] = aiStack_58[(long)cVar2 & 0xffffffff];
            lVar19 = lVar19 + 1;
            pcVar13 = pcVar13 + 3;
          } while (lVar19 != 4);
          local_40->v1_ = 0;
          local_40->v2_ = uVar17;
          local_40->v3_ = local_74;
          local_40->v4_ = uVar16;
          release_tets(local_40);
        }
      }
    }
  }
  return iVar8;
}

Assistant:

index_t nb_vertices() const {
            return nb_vertices_;
        }